

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noproxy.c
# Opt level: O0

_Bool Curl_cidr4_match(char *ipv4,char *network,uint bits)

{
  char cVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint hcheck;
  uint haddr;
  uint mask;
  uint check;
  uint address;
  uint bits_local;
  char *network_local;
  char *ipv4_local;
  
  mask = 0;
  haddr = 0;
  if (bits < 0x21) {
    check = bits;
    _address = network;
    network_local = ipv4;
    iVar2 = inet_pton(2,ipv4,&mask);
    if (iVar2 == 1) {
      iVar2 = inet_pton(2,_address,&haddr);
      if (iVar2 == 1) {
        if ((check == 0) || (check == 0x20)) {
          ipv4_local._7_1_ = mask == haddr;
        }
        else {
          cVar1 = (char)check;
          uVar3 = htonl(mask);
          uVar4 = htonl(haddr);
          if (((uVar3 ^ uVar4) & -1 << (0x20U - cVar1 & 0x1f)) == 0) {
            ipv4_local._7_1_ = true;
          }
          else {
            ipv4_local._7_1_ = false;
          }
        }
      }
      else {
        ipv4_local._7_1_ = false;
      }
    }
    else {
      ipv4_local._7_1_ = false;
    }
  }
  else {
    ipv4_local._7_1_ = false;
  }
  return ipv4_local._7_1_;
}

Assistant:

UNITTEST bool Curl_cidr4_match(const char *ipv4,    /* 1.2.3.4 address */
                               const char *network, /* 1.2.3.4 address */
                               unsigned int bits)
{
  unsigned int address = 0;
  unsigned int check = 0;

  if(bits > 32)
    /* strange input */
    return FALSE;

  if(1 != Curl_inet_pton(AF_INET, ipv4, &address))
    return FALSE;
  if(1 != Curl_inet_pton(AF_INET, network, &check))
    return FALSE;

  if(bits && (bits != 32)) {
    unsigned int mask = 0xffffffff << (32 - bits);
    unsigned int haddr = htonl(address);
    unsigned int hcheck = htonl(check);
#if 0
    fprintf(stderr, "Host %s (%x) network %s (%x) bits %u mask %x => %x\n",
            ipv4, haddr, network, hcheck, bits, mask,
            (haddr ^ hcheck) & mask);
#endif
    if((haddr ^ hcheck) & mask)
      return FALSE;
    return TRUE;
  }
  return (address == check);
}